

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_FuncTableAlloc(char *group,TA_StringTable **table)

{
  void *pvVar1;
  undefined8 *in_RSI;
  long in_RDI;
  TA_StringTablePriv *stringTablePriv;
  char *stringPtr;
  uint groupSize;
  uint groupId;
  TA_StringTable *stringTable;
  uint i;
  TA_RetCode retCode;
  TA_StringTable *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  char *pcVar2;
  uint local_30;
  TA_GroupId local_2c;
  uint *local_28;
  uint local_20;
  TA_RetCode local_1c;
  undefined8 *local_18;
  TA_RetCode local_4;
  
  if ((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    *in_RSI = 0;
    pcVar2 = (char *)0x0;
    local_18 = in_RSI;
    local_1c = getGroupId((char *)0x0,in_stack_ffffffffffffffc0);
    local_4 = local_1c;
    if ((local_1c == TA_SUCCESS) &&
       (local_1c = getGroupSize(local_2c,&local_30), local_4 = local_1c, local_1c == TA_SUCCESS)) {
      local_28 = (uint *)malloc(0x1c);
      if (local_28 == (uint *)0x0) {
        *local_18 = 0;
        local_4 = TA_ALLOC_ERR;
      }
      else {
        memset(local_28,0,0x1c);
        local_28[6] = 0xa20cb20c;
        *(uint **)(local_28 + 4) = local_28 + 6;
        *local_28 = local_30;
        if (local_30 != 0) {
          pvVar1 = malloc((ulong)*local_28 << 3);
          *(void **)(local_28 + 2) = pvVar1;
          if (*(long *)(local_28 + 2) == 0) {
            *local_18 = 0;
            TA_FuncTableFree(in_stack_ffffffffffffffb8);
            return TA_ALLOC_ERR;
          }
          memset(*(void **)(local_28 + 2),0,(ulong)*local_28 << 3);
          for (local_20 = 0; local_20 < *local_28; local_20 = local_20 + 1) {
            local_1c = getFuncNameByIdx(local_2c,local_20,(char **)&stack0xffffffffffffffc8);
            if (local_1c != TA_SUCCESS) {
              *local_18 = 0;
              TA_FuncTableFree(in_stack_ffffffffffffffb8);
              return TA_ALLOC_ERR;
            }
            *(char **)(*(long *)(local_28 + 2) + (ulong)local_20 * 8) = pcVar2;
            local_1c = TA_SUCCESS;
          }
        }
        *local_18 = local_28;
        local_4 = TA_SUCCESS;
      }
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_FuncTableAlloc( const char *group, TA_StringTable **table )
{
   TA_RetCode retCode;
   unsigned int i;
   TA_StringTable *stringTable;
   unsigned int groupId; /* TA_GroupId */
   unsigned int groupSize;
   const char *stringPtr;
   TA_StringTablePriv *stringTablePriv;

   if( (group == NULL) || (table == NULL ) )
   {
      return TA_BAD_PARAM;
   }

   *table = NULL;
   stringPtr = NULL;

   /* Get information on the group. */
   retCode = getGroupId( group, &groupId );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   retCode = getGroupSize( (TA_GroupId)groupId, &groupSize );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   /* Allocate the table. */

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_FUNC_MAGIC_NB;
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */
   stringTable->size = groupSize;
   if( groupSize != 0 )
   {
      stringTable->string = (const char **)TA_Malloc( (stringTable->size) *
                                                      sizeof(const char *) );

      if( stringTable->string == NULL )
      {
         *table = NULL;
         TA_FuncTableFree( stringTable );
         return TA_ALLOC_ERR;
      }

      memset( (void *)stringTable->string, 0,
              (stringTable->size) * sizeof(const char *) );

      for( i=0; i < stringTable->size; i++ )
      {
         retCode = getFuncNameByIdx( (TA_GroupId)groupId, i, &stringPtr );

         if( retCode != TA_SUCCESS )
         {
            *table = NULL;
            TA_FuncTableFree( stringTable );
            return TA_ALLOC_ERR;
         }

         (stringTable->string)[i] = stringPtr;
      }
   }

   /* Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}